

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglshaderprogram.cpp
# Opt level: O0

void __thiscall
QOpenGLShaderProgram::setAttributeBuffer
          (QOpenGLShaderProgram *this,char *name,GLenum type,int offset,int tupleSize,int stride)

{
  undefined4 in_ECX;
  int in_EDX;
  QOpenGLShaderProgram *in_RSI;
  undefined8 in_RDI;
  QOpenGLShaderProgram *unaff_retaddr;
  
  attributeLocation(in_RSI,(char *)CONCAT44(in_EDX,in_ECX));
  setAttributeBuffer(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(GLenum)in_RDI,
                     (int)((ulong)in_RSI >> 0x20),(int)in_RSI,in_EDX);
  return;
}

Assistant:

void QOpenGLShaderProgram::setAttributeBuffer
    (const char *name, GLenum type, int offset, int tupleSize, int stride)
{
    setAttributeBuffer(attributeLocation(name), type, offset, tupleSize, stride);
}